

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::FileModificationTime
          (string *__return_storage_ptr__,cmTimestamp *this,char *path,string *formatString,
          bool utcFlag)

{
  string *psVar1;
  bool bVar2;
  long timeT;
  string local_90;
  allocator local_59;
  string local_58;
  long local_38;
  time_t mtime;
  string *psStack_28;
  bool utcFlag_local;
  string *formatString_local;
  char *path_local;
  cmTimestamp *this_local;
  
  mtime._7_1_ = utcFlag;
  psStack_28 = formatString;
  formatString_local = (string *)path;
  path_local = (char *)this;
  this_local = (cmTimestamp *)__return_storage_ptr__;
  bVar2 = cmsys::SystemTools::FileExists(path);
  psVar1 = formatString_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,(char *)psVar1,&local_59);
    timeT = cmsys::SystemTools::ModifiedTime(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_38 = timeT;
    std::__cxx11::string::string((string *)&local_90,(string *)psStack_28);
    CreateTimestampFromTimeT(__return_storage_ptr__,this,timeT,&local_90,(bool)(mtime._7_1_ & 1));
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::FileModificationTime(const char* path,
                                              const std::string& formatString,
                                              bool utcFlag)
{
  if (!cmsys::SystemTools::FileExists(path)) {
    return std::string();
  }

  time_t mtime = cmsys::SystemTools::ModifiedTime(path);
  return CreateTimestampFromTimeT(mtime, formatString, utcFlag);
}